

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O0

QCborArray QCborArray::fromVariantList(QVariantList *list)

{
  bool bVar1;
  const_iterator o;
  QList<QVariant> *in_RSI;
  QExplicitlySharedDataPointer<QCborContainerPrivate> in_RDI;
  long in_FS_OFFSET;
  QVariant *v;
  QVariantList *__range1;
  QCborArray *a;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QVariant> *in_stack_ffffffffffffff80;
  qsizetype in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  QExplicitlySharedDataPointer<QCborContainerPrivate> variant;
  const_iterator d;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  variant.d.ptr = in_RDI.d.ptr;
  QCborArray((QCborArray *)0x48a08a);
  QList<QVariant>::size(in_RSI);
  detach((QCborArray *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
         in_stack_ffffffffffffff88);
  local_10.i = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QVariant>::begin(in_stack_ffffffffffffff80);
  o = QList<QVariant>::end(in_stack_ffffffffffffff80);
  while (d = o, bVar1 = QList<QVariant>::const_iterator::operator!=(&local_10,o), bVar1) {
    QList<QVariant>::const_iterator::operator*(&local_10);
    QExplicitlySharedDataPointer<QCborContainerPrivate>::data
              ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x48a14f);
    appendVariant((QCborContainerPrivate *)d.i,(QVariant *)variant.d.ptr);
    QList<QVariant>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)in_RDI.d.ptr;
}

Assistant:

QCborArray QCborArray::fromVariantList(const QVariantList &list)
{
    QCborArray a;
    a.detach(list.size());
    for (const QVariant &v : list)
        appendVariant(a.d.data(), v);
    return a;
}